

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

void QtPrivate::
     q_relocate_overlap_n_left_move<std::reverse_iterator<VkSpecParser::TypedName*>,long_long>
               (reverse_iterator<VkSpecParser::TypedName_*> first,longlong n,
               reverse_iterator<VkSpecParser::TypedName_*> d_first)

{
  TypedName *pTVar1;
  Data *pDVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  TypedName *pTVar6;
  int *piVar7;
  TypedName *pTVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  TypedName *pTVar11;
  long in_FS_OFFSET;
  Destructor local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.end.current = (TypedName *)((d_first.current)->name).d.d;
  pTVar6 = local_38.end.current + -n;
  pTVar1 = (TypedName *)((first.current)->name).d.d;
  pTVar11 = pTVar1;
  pTVar8 = pTVar6;
  if (pTVar6 < pTVar1) {
    pTVar11 = pTVar6;
    pTVar8 = pTVar1;
  }
  pTVar1 = (TypedName *)((d_first.current)->name).d.d;
  while (pTVar1 != pTVar8) {
    pDVar2 = ((first.current)->name).d.d;
    pDVar3 = (Data *)pDVar2[-5].super_QArrayData.alloc;
    pDVar2[-5].super_QArrayData.alloc = 0;
    pTVar1[-1].name.d.d = pDVar3;
    pcVar4 = *(char16_t **)&pDVar2[-4].super_QArrayData;
    pDVar2[-4].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-4].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pTVar1[-1].name.d.ptr = pcVar4;
    qVar5 = pDVar2[-4].super_QArrayData.alloc;
    pDVar2[-4].super_QArrayData.alloc = 0;
    pTVar1[-1].name.d.size = qVar5;
    pDVar3 = *(Data **)&pDVar2[-3].super_QArrayData;
    pDVar2[-3].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-3].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pTVar1[-1].type.d.d = pDVar3;
    pcVar4 = (char16_t *)pDVar2[-3].super_QArrayData.alloc;
    pDVar2[-3].super_QArrayData.alloc = 0;
    pTVar1[-1].type.d.ptr = pcVar4;
    qVar5 = *(qsizetype *)&pDVar2[-2].super_QArrayData;
    pDVar2[-2].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-2].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pTVar1[-1].type.d.size = qVar5;
    pDVar3 = (Data *)pDVar2[-2].super_QArrayData.alloc;
    pDVar2[-2].super_QArrayData.alloc = 0;
    pTVar1[-1].typeSuffix.d.d = pDVar3;
    pcVar4 = *(char16_t **)&pDVar2[-1].super_QArrayData;
    pDVar2[-1].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-1].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pTVar1[-1].typeSuffix.d.ptr = pcVar4;
    qVar5 = pDVar2[-1].super_QArrayData.alloc;
    pDVar2[-1].super_QArrayData.alloc = 0;
    pTVar1[-1].typeSuffix.d.size = qVar5;
    ((d_first.current)->name).d.d =
         (Data *)&((d_first.current)->name).d.d[-5].super_QArrayData.alloc;
    ((first.current)->name).d.d = (Data *)&((first.current)->name).d.d[-5].super_QArrayData.alloc;
    pTVar1 = (TypedName *)((d_first.current)->name).d.d;
  }
  local_38.iter = &local_38.end;
  local_38.intermediate.current = (TypedName *)((d_first.current)->name).d.d;
  while (pTVar1 = (TypedName *)((d_first.current)->name).d.d, pTVar1 != pTVar6) {
    pDVar2 = ((first.current)->name).d.d;
    pDVar3 = pTVar1[-1].name.d.d;
    pTVar1[-1].name.d.d = (Data *)pDVar2[-5].super_QArrayData.alloc;
    pDVar2[-5].super_QArrayData.alloc = (qsizetype)pDVar3;
    pcVar4 = pTVar1[-1].name.d.ptr;
    pTVar1[-1].name.d.ptr = *(char16_t **)&pDVar2[-4].super_QArrayData;
    *(char16_t **)&pDVar2[-4].super_QArrayData = pcVar4;
    qVar5 = pTVar1[-1].name.d.size;
    pTVar1[-1].name.d.size = pDVar2[-4].super_QArrayData.alloc;
    pDVar2[-4].super_QArrayData.alloc = qVar5;
    pDVar3 = pTVar1[-1].type.d.d;
    pTVar1[-1].type.d.d = *(Data **)&pDVar2[-3].super_QArrayData;
    *(Data **)&pDVar2[-3].super_QArrayData = pDVar3;
    pcVar4 = pTVar1[-1].type.d.ptr;
    pTVar1[-1].type.d.ptr = (char16_t *)pDVar2[-3].super_QArrayData.alloc;
    pDVar2[-3].super_QArrayData.alloc = (qsizetype)pcVar4;
    uVar9 = *(undefined4 *)&pTVar1[-1].type.d.size;
    uVar10 = *(undefined4 *)((long)&pTVar1[-1].type.d.size + 4);
    pTVar1[-1].type.d.size = *(qsizetype *)&pDVar2[-2].super_QArrayData;
    pDVar2[-2].super_QArrayData.ref_ = (QBasicAtomicInt)uVar9;
    pDVar2[-2].super_QArrayData.flags = (ArrayOptions)uVar10;
    pDVar3 = pTVar1[-1].typeSuffix.d.d;
    pTVar1[-1].typeSuffix.d.d = (Data *)pDVar2[-2].super_QArrayData.alloc;
    pDVar2[-2].super_QArrayData.alloc = (qsizetype)pDVar3;
    pcVar4 = pTVar1[-1].typeSuffix.d.ptr;
    pTVar1[-1].typeSuffix.d.ptr = *(char16_t **)&pDVar2[-1].super_QArrayData;
    *(char16_t **)&pDVar2[-1].super_QArrayData = pcVar4;
    qVar5 = pTVar1[-1].typeSuffix.d.size;
    pTVar1[-1].typeSuffix.d.size = pDVar2[-1].super_QArrayData.alloc;
    pDVar2[-1].super_QArrayData.alloc = qVar5;
    ((d_first.current)->name).d.d =
         (Data *)&((d_first.current)->name).d.d[-5].super_QArrayData.alloc;
    ((first.current)->name).d.d = (Data *)&((first.current)->name).d.d[-5].super_QArrayData.alloc;
  }
  while (pTVar6 = (TypedName *)((first.current)->name).d.d, pTVar6 != pTVar11) {
    ((first.current)->name).d.d = (Data *)(pTVar6 + 1);
    pDVar2 = (pTVar6->typeSuffix).d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate(&((pTVar6->typeSuffix).d.d)->super_QArrayData,2,0x10);
      }
    }
    pDVar2 = (pTVar6->type).d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate(&((pTVar6->type).d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar7 = *(int **)&(pTVar6->name).d.d;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        QArrayData::deallocate(*(QArrayData **)&(pTVar6->name).d.d,2,0x10);
      }
    }
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<VkSpecParser::TypedName_*>,_long_long>::
  Destructor::~Destructor(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}